

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall
DIntermissionScreenScroller::Init
          (DIntermissionScreenScroller *this,FIntermissionAction *desc,bool first)

{
  FTextureID FVar1;
  char *name;
  bool first_local;
  FIntermissionAction *desc_local;
  DIntermissionScreenScroller *this_local;
  
  DIntermissionScreen::Init(&this->super_DIntermissionScreen,desc,first);
  (this->mFirstPic).texnum = (this->super_DIntermissionScreen).mBackground.texnum;
  name = FString::operator_cast_to_char_((FString *)(desc + 1));
  FVar1 = FTextureManager::CheckForTexture(&TexMan,name,8,1);
  (this->mSecondPic).texnum = FVar1.texnum;
  this->mScrollDelay = desc[1].mSize;
  this->mScrollTime = *(int *)&desc[1].field_0xc;
  this->mScrollDir = *(int *)&desc[1].mClass;
  return;
}

Assistant:

void DIntermissionScreenScroller::Init(FIntermissionAction *desc, bool first)
{
	Super::Init(desc, first);
	mFirstPic = mBackground;
	mSecondPic = TexMan.CheckForTexture(static_cast<FIntermissionActionScroller*>(desc)->mSecondPic, FTexture::TEX_MiscPatch);
	mScrollDelay = static_cast<FIntermissionActionScroller*>(desc)->mScrollDelay;
	mScrollTime = static_cast<FIntermissionActionScroller*>(desc)->mScrollTime;
	mScrollDir = static_cast<FIntermissionActionScroller*>(desc)->mScrollDir;
}